

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

string * __thiscall
QUtil::uint_to_string_base_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,unsigned_long_long num,int base,int length)

{
  bool bVar1;
  ulong uVar2;
  char cVar3;
  logic_error *this_00;
  QUtil *pQVar4;
  uint uVar5;
  type ii;
  char cVar6;
  int iVar7;
  int iVar8;
  string cvt;
  ostringstream buf;
  undefined1 *local_1f0;
  ulong local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  locale local_1d0 [8];
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8;
  uint local_1a0;
  long local_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  uVar5 = (uint)num;
  if ((0x10 < uVar5) || ((0x10500U >> (uVar5 & 0x1f) & 1) == 0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"int_to_string_base called with unsupported base");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_1e8 = 0;
  local_1e0 = 0;
  local_1f0 = &local_1e0;
  if (uVar5 == 10) {
    cVar6 = '\x01';
    if ((QUtil *)0x9 < this) {
      pQVar4 = this;
      cVar3 = '\x04';
      do {
        cVar6 = cVar3;
        if (pQVar4 < (QUtil *)0x64) {
          cVar6 = cVar6 + -2;
          goto LAB_0023f03e;
        }
        if (pQVar4 < (QUtil *)0x3e8) {
          cVar6 = cVar6 + -1;
          goto LAB_0023f03e;
        }
        if (pQVar4 < (QUtil *)0x2710) goto LAB_0023f03e;
        bVar1 = (QUtil *)0x1869f < pQVar4;
        pQVar4 = (QUtil *)((ulong)pQVar4 / 10000);
        cVar3 = cVar6 + '\x04';
      } while (bVar1);
      cVar6 = cVar6 + '\x01';
    }
LAB_0023f03e:
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct((ulong)&local_1a8,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)local_1a8,local_1a0,(unsigned_long_long)this);
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1a8);
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::locale::classic();
    std::ios::imbue(local_1d0);
    std::locale::~locale(local_1d0);
    if (uVar5 == 8) {
      uVar5 = 0x40;
    }
    else if (uVar5 == 10) {
      uVar5 = 2;
    }
    else {
      uVar5 = (uint)(uVar5 == 0x10) << 3;
    }
    *(uint *)((long)auStack_190 + local_1a8[-3]) =
         *(uint *)((long)auStack_190 + local_1a8[-3]) & 0xffffffb5 | uVar5;
    *(uint *)((long)auStack_190 + local_1a8[-3]) =
         *(uint *)((long)auStack_190 + local_1a8[-3]) & 0xffffbfff;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  uVar2 = local_1e8;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((local_1e8 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_1e8);
  }
  iVar7 = (int)uVar2;
  if (iVar7 < base && 0 < base) {
    iVar8 = base - iVar7;
    if (iVar8 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar8);
    }
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,(char)iVar8)
    ;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1f0);
  if (base < 0) {
    iVar8 = -base - iVar7;
    if (iVar8 != 0 && iVar7 <= -base) {
      if (iVar8 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar8);
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 (char)iVar8);
    }
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
int_to_string_base_internal(T num, int base, int length)
{
    // Backward compatibility -- int_to_string, which calls this function, used to use sprintf with
    // %0*d, so we interpret length such that a negative value appends spaces and a positive value
    // prepends zeroes.
    if (!((base == 8) || (base == 10) || (base == 16))) {
        throw std::logic_error("int_to_string_base called with unsupported base");
    }
    std::string cvt;
    if (base == 10) {
        // Use the more efficient std::to_string when possible
        cvt = std::to_string(num);
    } else {
        std::ostringstream buf;
        buf.imbue(std::locale::classic());
        buf << std::setbase(base) << std::nouppercase << num;
        cvt = buf.str();
    }
    std::string result;
    int str_length = QIntC::to_int(cvt.length());
    if ((length > 0) && (str_length < length)) {
        result.append(QIntC::to_size(length - str_length), '0');
    }
    result += cvt;
    if ((length < 0) && (str_length < -length)) {
        result.append(QIntC::to_size(-length - str_length), ' ');
    }
    return result;
}